

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O0

void __thiscall Sequence::process_itemset(Sequence *this,Itemset_S *iset,uint templ,int iter)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<Itemset> *psVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  element_type *peVar7;
  size_type sVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  __shared_ptr *this_00;
  __shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var12;
  element_type *peVar13;
  reference pvVar14;
  shared_ptr<Itemset> local_130;
  shared_ptr<Itemset> local_120;
  undefined1 local_110 [48];
  shared_ptr<Itemset> local_e0;
  shared_ptr<Itemset> local_d0;
  undefined1 local_c0 [68];
  int local_7c;
  undefined1 local_78 [4];
  int it;
  Itemset_S ljoin;
  Itemset_S ejoin;
  Itemset_S iset2;
  int local_40;
  uint ntpl;
  int esup;
  int lsup;
  int it2;
  int i;
  ostringstream *seqstrm;
  ostringstream *logger;
  int iter_local;
  uint templ_local;
  Itemset_S *iset_local;
  Sequence *this_local;
  
  logger._0_4_ = iter;
  logger._4_4_ = templ;
  _iter_local = iset;
  iset_local = (Itemset_S *)this;
  peVar7 = std::
           __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->numLargeItemset);
  sVar8 = std::vector<int,_std::allocator<int>_>::size(peVar7);
  if ((ulong)(long)iter <= sVar8) {
    seqstrm = &this->env->logger;
    _it2 = this->env;
    std::shared_ptr<Itemset>::shared_ptr
              ((shared_ptr<Itemset> *)
               &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<Itemset>::shared_ptr
              ((shared_ptr<Itemset> *)
               &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<Itemset>::shared_ptr((shared_ptr<Itemset> *)local_78);
    peVar9 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        iset);
    local_7c = Itemset::operator[](peVar9,0);
    peVar10 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->args);
    iVar3 = (int)logger;
    if (peVar10->maxiter < (int)logger) {
      peVar10 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->args);
      peVar10->maxiter = iVar3;
    }
    peVar11 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->invdb);
    this_00 = (__shared_ptr *)InvertDatabase::get_eqgraph_item(peVar11,local_7c);
    bVar4 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (bVar4) {
      lsup = 0;
      while( true ) {
        iVar3 = lsup;
        peVar11 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->invdb);
        p_Var12 = (__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  InvertDatabase::get_eqgraph_item(peVar11,local_7c);
        peVar13 = std::__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var12);
        iVar5 = EqGrNode::num_elements(peVar13);
        if (iVar5 <= iVar3) break;
        peVar11 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->invdb);
        p_Var12 = (__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  InvertDatabase::get_eqgraph_item(peVar11,local_7c);
        peVar13 = std::__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var12);
        esup = EqGrNode::get_element(peVar13,lsup);
        uVar6 = logger._4_4_;
        peVar11 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->invdb);
        InvertDatabase::get_item((InvertDatabase *)(local_c0 + 0x20),(int)peVar11);
        p_Var1 = &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::shared_ptr<Itemset>::operator=
                  ((shared_ptr<Itemset> *)p_Var1,(shared_ptr<Itemset> *)(local_c0 + 0x20));
        std::shared_ptr<Itemset>::~shared_ptr((shared_ptr<Itemset> *)(local_c0 + 0x20));
        psVar2 = (shared_ptr<Itemset> *)(local_c0 + 0x10);
        std::shared_ptr<Itemset>::shared_ptr(psVar2,(nullptr_t)0x0);
        std::shared_ptr<Itemset>::operator=((shared_ptr<Itemset> *)local_78,psVar2);
        std::shared_ptr<Itemset>::~shared_ptr(psVar2);
        prune_decision((Sequence *)local_c0,(Itemset_S *)this,(Itemset_S *)p_Var1,(uint)iset,uVar6);
        std::shared_ptr<Itemset>::operator=
                  ((shared_ptr<Itemset> *)
                   &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (shared_ptr<Itemset> *)local_c0);
        std::shared_ptr<Itemset>::~shared_ptr((shared_ptr<Itemset> *)local_c0);
        peVar10 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->args);
        if (1 < peVar10->pruning_type) {
          pre_pruning(this,(Itemset_S *)
                           &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,uVar6,iset,
                      (Itemset_S *)
                      &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                      '\0');
        }
        bVar4 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (bVar4) {
          get_tmpnewf_intersect
                    (this,(Itemset_S *)local_78,
                     (Itemset_S *)
                     &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (Itemset_S *)local_78,(int *)&ntpl,&local_40,(int *)&ntpl,
                     (Itemset_S *)
                     &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,iset
                     ,(int)logger);
        }
        bVar4 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (bVar4) {
          fill_join(this,(Itemset_S *)
                         &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                    iset,(Itemset_S *)
                         &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
          ;
        }
        peVar10 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->args);
        if (1 < peVar10->pruning_type) {
          post_pruning(this,(Itemset_S *)
                            &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,uVar6);
        }
        bVar4 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (bVar4) {
          peVar7 = std::
                   __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->numLargeItemset);
          pvVar14 = std::vector<int,_std::allocator<int>_>::at(peVar7,(long)((int)logger + -1));
          *pvVar14 = *pvVar14 + 1;
          peVar10 = std::
                    __shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->args);
          if (peVar10->outputfreq != '\0') {
            peVar9 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
            Itemset::print_seq(peVar9,(ostream *)_it2,uVar6);
          }
          std::shared_ptr<Itemset>::shared_ptr
                    (&local_d0,
                     (shared_ptr<Itemset> *)
                     &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          process_itemset(this,&local_d0,uVar6,(int)logger + 1);
          std::shared_ptr<Itemset>::~shared_ptr(&local_d0);
          std::shared_ptr<Itemset>::shared_ptr(&local_e0,(nullptr_t)0x0);
          std::shared_ptr<Itemset>::operator=
                    ((shared_ptr<Itemset> *)
                     &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     &local_e0);
          std::shared_ptr<Itemset>::~shared_ptr(&local_e0);
        }
        lsup = lsup + 1;
      }
      lsup = 0;
      while( true ) {
        iVar3 = lsup;
        peVar11 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->invdb);
        p_Var12 = (__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  InvertDatabase::get_eqgraph_item(peVar11,local_7c);
        peVar13 = std::__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var12);
        iVar5 = EqGrNode::seqnum_elements(peVar13);
        if (iVar5 <= iVar3) break;
        peVar11 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->invdb);
        p_Var12 = (__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  InvertDatabase::get_eqgraph_item(peVar11,local_7c);
        peVar13 = std::__shared_ptr_access<EqGrNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var12);
        esup = EqGrNode::seqget_element(peVar13,lsup);
        uVar6 = logger._4_4_ | 1 << ((byte)((char)logger - 2) & 0x1f);
        peVar11 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->invdb);
        InvertDatabase::get_item((InvertDatabase *)(local_110 + 0x20),(int)peVar11);
        p_Var1 = &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::shared_ptr<Itemset>::operator=
                  ((shared_ptr<Itemset> *)p_Var1,(shared_ptr<Itemset> *)(local_110 + 0x20));
        std::shared_ptr<Itemset>::~shared_ptr((shared_ptr<Itemset> *)(local_110 + 0x20));
        psVar2 = (shared_ptr<Itemset> *)(local_110 + 0x10);
        std::shared_ptr<Itemset>::shared_ptr(psVar2,(nullptr_t)0x0);
        std::shared_ptr<Itemset>::operator=
                  ((shared_ptr<Itemset> *)
                   &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,psVar2
                  );
        std::shared_ptr<Itemset>::~shared_ptr(psVar2);
        prune_decision((Sequence *)local_110,(Itemset_S *)this,(Itemset_S *)p_Var1,(uint)iset,uVar6)
        ;
        std::shared_ptr<Itemset>::operator=
                  ((shared_ptr<Itemset> *)local_78,(shared_ptr<Itemset> *)local_110);
        std::shared_ptr<Itemset>::~shared_ptr((shared_ptr<Itemset> *)local_110);
        peVar10 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->args);
        if (1 < peVar10->pruning_type) {
          pre_pruning(this,(Itemset_S *)local_78,uVar6,iset,
                      (Itemset_S *)
                      &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                      '\x01');
        }
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
        if (bVar4) {
          p_Var1 = &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          get_tmpnewf_intersect
                    (this,(Itemset_S *)local_78,(Itemset_S *)p_Var1,(Itemset_S *)p_Var1,(int *)&ntpl
                     ,&local_40,&local_40,
                     (Itemset_S *)
                     &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,iset
                     ,(int)logger);
        }
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
        if (bVar4) {
          fill_join(this,(Itemset_S *)local_78,iset,
                    (Itemset_S *)
                    &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        peVar10 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->args);
        if (1 < peVar10->pruning_type) {
          post_pruning(this,(Itemset_S *)local_78,uVar6);
        }
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
        if (bVar4) {
          peVar7 = std::
                   __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->numLargeItemset);
          pvVar14 = std::vector<int,_std::allocator<int>_>::at(peVar7,(long)((int)logger + -1));
          *pvVar14 = *pvVar14 + 1;
          peVar10 = std::
                    __shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->args);
          if (peVar10->outputfreq != '\0') {
            peVar9 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_78);
            Itemset::print_seq(peVar9,(ostream *)_it2,uVar6);
          }
          std::shared_ptr<Itemset>::shared_ptr(&local_120,(shared_ptr<Itemset> *)local_78);
          process_itemset(this,&local_120,uVar6,(int)logger + 1);
          std::shared_ptr<Itemset>::~shared_ptr(&local_120);
          std::shared_ptr<Itemset>::shared_ptr(&local_130,(nullptr_t)0x0);
          std::shared_ptr<Itemset>::operator=((shared_ptr<Itemset> *)local_78,&local_130);
          std::shared_ptr<Itemset>::~shared_ptr(&local_130);
        }
        lsup = lsup + 1;
      }
    }
    std::shared_ptr<Itemset>::~shared_ptr((shared_ptr<Itemset> *)local_78);
    std::shared_ptr<Itemset>::~shared_ptr
              ((shared_ptr<Itemset> *)
               &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<Itemset>::~shared_ptr
              ((shared_ptr<Itemset> *)
               &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void Sequence::process_itemset(Itemset_S iset, unsigned int templ, int iter) {
    if (iter > numLargeItemset->size()) return;

    ostringstream &logger = env.logger;
    ostringstream &seqstrm = env.seqstrm;

    int i, it2;
    int lsup, esup;
    unsigned int ntpl;
    Itemset_S iset2, ejoin, ljoin;
    int it = (*iset)[0];
    if (args->maxiter < iter) args->maxiter = iter;
    if (invdb->get_eqgraph_item(it)) {
        for (i = 0; i < invdb->get_eqgraph_item(it)->num_elements(); i++) {
            it2 = invdb->get_eqgraph_item(it)->get_element(i);
            ntpl = templ;
            iset2 = invdb->get_item(it2);
            ljoin = nullptr;
            ejoin = prune_decision(iset2, iset, ntpl, EJOIN);
            if (args->pruning_type > 1) pre_pruning(ejoin, ntpl, iset, iset2, 0);
            if (ejoin) get_tmpnewf_intersect(ljoin, ejoin, ljoin, lsup, esup, lsup, iset2, iset, iter);
            if (ejoin) fill_join(ejoin, iset, iset2);
            if (args->pruning_type > 1) post_pruning(ejoin, ntpl);
            if (ejoin) {
                numLargeItemset->at(iter - 1)++;
                //fill_join(ejoin, iset, iset2);
                //if (iter > 3) ejoin->print_seq(seqstrm, ntpl);
                if (args->outputfreq) ejoin->print_seq(seqstrm, ntpl);
                process_itemset(ejoin, ntpl, iter + 1);
                ejoin = nullptr;
            }
        }

        for (i = 0; i < invdb->get_eqgraph_item(it)->seqnum_elements(); i++) {
            it2 = invdb->get_eqgraph_item(it)->seqget_element(i);
            ntpl = SETBIT(templ, 1, iter - 2);
            iset2 = invdb->get_item(it2);
            ejoin = nullptr;
            ljoin = prune_decision(iset2, iset, ntpl, LJOIN);
            if (args->pruning_type > 1) pre_pruning(ljoin, ntpl, iset, iset2, 1);
            if (ljoin) get_tmpnewf_intersect(ljoin, ejoin, ejoin, lsup, esup, esup, iset2, iset, iter);
            if (ljoin) fill_join(ljoin, iset, iset2);
            if (args->pruning_type > 1) post_pruning(ljoin, ntpl);
            if (ljoin) {
                numLargeItemset->at(iter - 1)++;
                //fill_join(ljoin, iset, iset2);
                //if (iter > 3) ljoin->print_seq(seqstrm, ntpl);
                if (args->outputfreq) ljoin->print_seq(seqstrm, ntpl);
                process_itemset(ljoin, ntpl, iter + 1);
                ljoin = nullptr;
            }
        }
    }
}